

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
          (QMovableArrayOps<QItemSelectionRange> *this,qsizetype i,QItemSelectionRange *args)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  undefined8 in_RDX;
  QArrayDataPointer<QItemSelectionRange> *in_RSI;
  QArrayDataPointer<QItemSelectionRange> *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QItemSelectionRange tmp;
  QItemSelectionRange *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar6;
  undefined2 in_stack_ffffffffffffffa4;
  byte bVar7;
  GrowthPosition where;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QArrayDataPointer<QItemSelectionRange>::needsDetach
                    ((QArrayDataPointer<QItemSelectionRange> *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  if (!(bool)uVar2) {
    if ((in_RSI == (QArrayDataPointer<QItemSelectionRange> *)in_RDI->size) &&
       (qVar4 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtEnd(in_RDI), qVar4 != 0)) {
      QArrayDataPointer<QItemSelectionRange>::end
                ((QArrayDataPointer<QItemSelectionRange> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_008d3486;
    }
    if ((in_RSI == (QArrayDataPointer<QItemSelectionRange> *)0x0) &&
       (qVar4 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtBegin(in_RDI), qVar4 != 0)) {
      QArrayDataPointer<QItemSelectionRange>::begin
                ((QArrayDataPointer<QItemSelectionRange> *)0x8d3354);
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_008d3486;
    }
  }
  QItemSelectionRange::QItemSelectionRange
            ((QItemSelectionRange *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  bVar5 = in_RDI->size != 0;
  uVar6 = bVar5 && in_RSI == (QArrayDataPointer<QItemSelectionRange> *)0x0;
  uVar3 = (uint)(bVar5 && in_RSI == (QArrayDataPointer<QItemSelectionRange> *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QItemSelectionRange>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffa4,uVar3))),
             (QItemSelectionRange **)in_RDI,
             (QArrayDataPointer<QItemSelectionRange> *)CONCAT17(uVar6,in_stack_ffffffffffffff90));
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar2,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffa4,uVar3))),
                       in_RDI,CONCAT17(uVar6,in_stack_ffffffffffffff90),
                       (qsizetype)in_stack_ffffffffffffff88);
    Inserter::insertOne((Inserter *)CONCAT17(uVar6,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
    Inserter::~Inserter((Inserter *)CONCAT17(uVar6,in_stack_ffffffffffffff90));
  }
  else {
    QArrayDataPointer<QItemSelectionRange>::begin
              ((QArrayDataPointer<QItemSelectionRange> *)0x8d341a);
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)CONCAT17(uVar6,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QItemSelectionRange::~QItemSelectionRange
            ((QItemSelectionRange *)CONCAT17(uVar6,in_stack_ffffffffffffff90));
LAB_008d3486:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }